

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JammingTechnique.h
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EmitterBeam::SetJammingTechnique(EmitterBeam *this,JammingTechnique *JT)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  
  KVar1 = JT->m_ui8Category;
  KVar2 = JT->m_ui8Subcategory;
  KVar3 = JT->m_ui8Specific;
  (this->m_JammingTechnique).m_ui8Kind = JT->m_ui8Kind;
  (this->m_JammingTechnique).m_ui8Category = KVar1;
  (this->m_JammingTechnique).m_ui8Subcategory = KVar2;
  (this->m_JammingTechnique).m_ui8Specific = KVar3;
  return;
}

Assistant:

class KDIS_EXPORT JammingTechnique : public DataTypeBase
{
protected:

    KUINT8 m_ui8Kind;

    KUINT8 m_ui8Category;

    KUINT8 m_ui8Subcategory;

    KUINT8 m_ui8Specific;

public:

    static const KUINT16 JAMMING_TECHNIQUE_SIZE = 4;

    JammingTechnique();

    JammingTechnique(KDataStream &stream) noexcept(false);

    JammingTechnique( KUINT8 KIND, KUINT8 CATEGORY, KUINT8 SUBCATEGORY,
                 KUINT8 SPECIFIC );

    virtual ~JammingTechnique();

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::SetKind
    //              KDIS::DATA_TYPE::JammingTechnique::GetKind
    // Description: Kind.
    // Parameter:   KUINT8 KIND, void
    //************************************
    void SetKind( KUINT8 KIND );
    KUINT8 GetKind() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::SetCategory
    //              KDIS::DATA_TYPE::JammingTechnique::GetCategory
    // Description: Category.
    // Parameter:   KUINT8 CATEGORY, void
    //************************************
    void SetCategory( KUINT8 CATEGORY );
    KUINT8 GetCategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::SetSubcategory
    //              KDIS::DATA_TYPE::JammingTechnique::GetSubcategory
    // Description: Kind.
    // Parameter:   KUINT8 SUBCATEGORY, void
    //************************************
    void SetSubcategory( KUINT8 SUBCATEGORY );
    KUINT8 GetSubcategory() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::SetSpecific
    //              KDIS::DATA_TYPE::JammingTechnique::GetSpecific
    // Description: Kind.
    // Parameter:   KUINT8 SPECIFIC, void
    //************************************
    void SetSpecific( KUINT8 SPECIFIC );
    KUINT8 GetSpecific() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::JammingTechnique::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const JammingTechnique & Value ) const;
    KBOOL operator != ( const JammingTechnique & Value ) const;
}